

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O2

bool burst::detail::
     collect_impl<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
               (unsigned_long *first,unsigned_long *last,long param_3,int *param_4)

{
  pair<int_*,_int> pVar1;
  bool is_sorted;
  unsigned_long previous;
  undefined1 local_61;
  long local_60;
  undefined1 local_53;
  undefined1 local_52 [2];
  undefined8 local_50;
  long *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  
  local_30 = &local_50;
  local_50 = 0;
  local_48 = &local_60;
  local_28 = &local_61;
  local_61 = 1;
  local_40 = local_52;
  local_38 = &local_53;
  local_60 = param_3;
  for (; first != last; first = first + 1) {
    collect_impl<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>(__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>)
    ::{lambda(auto:1_const&)#1}::operator()((_lambda_auto_1_const___1_ *)&local_48,first);
  }
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60,local_60 + 0x400,local_60);
  *param_4 = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x400,local_60 + 0x800,local_60 + 0x400);
  param_4[1] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x800,local_60 + 0xc00,local_60 + 0x800);
  param_4[2] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0xc00,local_60 + 0x1000,local_60 + 0xc00);
  param_4[3] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x1000,local_60 + 0x1400,local_60 + 0x1000);
  param_4[4] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x1400,local_60 + 0x1800,local_60 + 0x1400);
  param_4[5] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x1800,local_60 + 0x1c00,local_60 + 0x1800);
  param_4[6] = pVar1.second;
  pVar1 = partial_sum_max<int*,int*,std::plus<void>,std::less<void>>
                    (local_60 + 0x1c00,local_60 + 0x2000,local_60 + 0x1c00);
  param_4[7] = pVar1.second;
  return (bool)local_61;
}

Assistant:

bool collect_impl (ForwardIterator first, ForwardIterator last, Map map, Radix radix, RandomAccessIterator1 counters, RandomAccessIterator2 maximums, std::index_sequence<Radices...>)
        {
            using value_type = iterator_value_t<ForwardIterator>;
            constexpr auto radix_value_range = radix_sort_traits<value_type, Map, Radix>::radix_value_range;

            auto previous = std::numeric_limits<invoke_result_t<Map, value_type>>::min();
            auto is_sorted = true;
            std::for_each(first, last,
                [& counters, & map, & radix, & previous, & is_sorted] (const auto & preimage)
                {
                    auto image = map(preimage);
                    is_sorted &= (image >= previous);
                    previous = image;

                    BURST_EXPAND_VARIADIC(++counters[Radices][nth_radix(Radices, radix)(image)]);
                });

            BURST_EXPAND_VARIADIC(maximums[Radices] = partial_sum_max(counters[Radices], counters[Radices] + radix_value_range, counters[Radices]).second);

            return is_sorted;
        }